

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

void __thiscall
math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>::eval_divide_knuth
          (uintwide_t<512U,_unsigned_int,_void,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other,
          uintwide_t<24U,_unsigned_char,_void,_false> *remainder)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  unsigned_fast_type v_offset;
  unsigned_fast_type u_offset;
  
  lVar10 = 0x40;
  u_offset = 0;
  do {
    if (*(int *)((long)(this->values).super_array<unsigned_int,_16UL>.elems + lVar10 + -4) != 0)
    goto LAB_0014f84c;
    u_offset = u_offset + 1;
    lVar10 = lVar10 + -4;
  } while (lVar10 != 0);
  u_offset = 0x10;
LAB_0014f84c:
  lVar10 = 0x40;
  v_offset = 0;
  do {
    if (*(int *)((other->values).super_array<unsigned_char,_3UL>.elems + lVar10 + -4) != 0) {
      if (lVar10 != 0) {
        if (u_offset != 0x10) {
          lVar10 = 0x3c;
          while (lVar10 != -4) {
            uVar1 = *(uint *)((other->values).super_array<unsigned_char,_3UL>.elems + lVar10);
            uVar2 = *(uint *)((long)(this->values).super_array<unsigned_int,_16UL>.elems + lVar10);
            lVar10 = lVar10 + -4;
            if (uVar2 != uVar1) {
              if (uVar2 <= uVar1) {
                if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
                  uVar3 = *(undefined8 *)(this->values).super_array<unsigned_int,_16UL>.elems;
                  uVar4 = *(undefined8 *)((this->values).super_array<unsigned_int,_16UL>.elems + 2);
                  uVar5 = *(undefined8 *)((this->values).super_array<unsigned_int,_16UL>.elems + 4);
                  uVar6 = *(undefined8 *)((this->values).super_array<unsigned_int,_16UL>.elems + 6);
                  uVar7 = *(undefined8 *)((this->values).super_array<unsigned_int,_16UL>.elems + 8);
                  uVar8 = *(undefined8 *)((this->values).super_array<unsigned_int,_16UL>.elems + 10)
                  ;
                  uVar9 = *(undefined8 *)
                           ((this->values).super_array<unsigned_int,_16UL>.elems + 0xe);
                  *(undefined8 *)(remainder + 0x10) =
                       *(undefined8 *)((this->values).super_array<unsigned_int,_16UL>.elems + 0xc);
                  *(undefined8 *)(remainder[0x12].values.super_array<unsigned_char,_3UL>.elems + 2)
                       = uVar9;
                  *(undefined8 *)(remainder[10].values.super_array<unsigned_char,_3UL>.elems + 2) =
                       uVar7;
                  *(undefined8 *)(remainder[0xd].values.super_array<unsigned_char,_3UL>.elems + 1) =
                       uVar8;
                  *(undefined8 *)(remainder[5].values.super_array<unsigned_char,_3UL>.elems + 1) =
                       uVar5;
                  *(undefined8 *)(remainder + 8) = uVar6;
                  *(undefined8 *)remainder = uVar3;
                  *(undefined8 *)(remainder[2].values.super_array<unsigned_char,_3UL>.elems + 2) =
                       uVar4;
                }
                (this->values).super_array<unsigned_int,_16UL>.elems[0xc] = 0;
                (this->values).super_array<unsigned_int,_16UL>.elems[0xd] = 0;
                (this->values).super_array<unsigned_int,_16UL>.elems[0xe] = 0;
                (this->values).super_array<unsigned_int,_16UL>.elems[0xf] = 0;
                (this->values).super_array<unsigned_int,_16UL>.elems[8] = 0;
                (this->values).super_array<unsigned_int,_16UL>.elems[9] = 0;
                (this->values).super_array<unsigned_int,_16UL>.elems[10] = 0;
                (this->values).super_array<unsigned_int,_16UL>.elems[0xb] = 0;
                (this->values).super_array<unsigned_int,_16UL>.elems[4] = 0;
                (this->values).super_array<unsigned_int,_16UL>.elems[5] = 0;
                (this->values).super_array<unsigned_int,_16UL>.elems[6] = 0;
                (this->values).super_array<unsigned_int,_16UL>.elems[7] = 0;
                (this->values).super_array<unsigned_int,_16UL>.elems[0] = 0;
                (this->values).super_array<unsigned_int,_16UL>.elems[1] = 0;
                (this->values).super_array<unsigned_int,_16UL>.elems[2] = 0;
                (this->values).super_array<unsigned_int,_16UL>.elems[3] = 0;
                return;
              }
              void_math::wide_integer::uintwide_t<512u,unsigned_int,void,false>::
              eval_divide_knuth_core<512u>(unsigned_long,unsigned_long,math::wide_integer::
              uintwide_t<512u,unsigned_int,void,false>const&,math::wide_integer::
              uintwide_t<512u,unsigned_int,void,false>*,std::
              enable_if<((512u)>(static_cast<unsigned_int>(std::numeric_limits<unsigned_int>::
              digits))),int>::type__
                        (this,u_offset,v_offset,other,remainder,
                         (enable_if_t<(512U_>_static_cast<size_t>_std__numeric_limits<limb_type>__digits____int>
                          *)0x0);
              return;
            }
          }
          (this->values).super_array<unsigned_int,_16UL>.elems[0] = 1;
          (this->values).super_array<unsigned_int,_16UL>.elems[1] = 0;
          (this->values).super_array<unsigned_int,_16UL>.elems[2] = 0;
          (this->values).super_array<unsigned_int,_16UL>.elems[3] = 0;
          (this->values).super_array<unsigned_int,_16UL>.elems[4] = 0;
          (this->values).super_array<unsigned_int,_16UL>.elems[5] = 0;
          (this->values).super_array<unsigned_int,_16UL>.elems[6] = 0;
          (this->values).super_array<unsigned_int,_16UL>.elems[7] = 0;
          (this->values).super_array<unsigned_int,_16UL>.elems[8] = 0;
          (this->values).super_array<unsigned_int,_16UL>.elems[9] = 0;
          (this->values).super_array<unsigned_int,_16UL>.elems[10] = 0;
          (this->values).super_array<unsigned_int,_16UL>.elems[0xb] = 0;
          (this->values).super_array<unsigned_int,_16UL>.elems[0xc] = 0;
          (this->values).super_array<unsigned_int,_16UL>.elems[0xc] = 0;
          (this->values).super_array<unsigned_int,_16UL>.elems[0xd] = 0;
          (this->values).super_array<unsigned_int,_16UL>.elems[0xe] = 0;
          (this->values).super_array<unsigned_int,_16UL>.elems[0xf] = 0;
        }
        goto joined_r0x0014f8ea;
      }
      break;
    }
    v_offset = v_offset + 1;
    lVar10 = lVar10 + -4;
  } while (lVar10 != 0);
  (this->values).super_array<unsigned_int,_16UL>.elems[0xc] = 0xffffffff;
  (this->values).super_array<unsigned_int,_16UL>.elems[0xd] = 0xffffffff;
  (this->values).super_array<unsigned_int,_16UL>.elems[0xe] = 0xffffffff;
  (this->values).super_array<unsigned_int,_16UL>.elems[0xf] = 0xffffffff;
  (this->values).super_array<unsigned_int,_16UL>.elems[8] = 0xffffffff;
  (this->values).super_array<unsigned_int,_16UL>.elems[9] = 0xffffffff;
  (this->values).super_array<unsigned_int,_16UL>.elems[10] = 0xffffffff;
  (this->values).super_array<unsigned_int,_16UL>.elems[0xb] = 0xffffffff;
  (this->values).super_array<unsigned_int,_16UL>.elems[4] = 0xffffffff;
  (this->values).super_array<unsigned_int,_16UL>.elems[5] = 0xffffffff;
  (this->values).super_array<unsigned_int,_16UL>.elems[6] = 0xffffffff;
  (this->values).super_array<unsigned_int,_16UL>.elems[7] = 0xffffffff;
  (this->values).super_array<unsigned_int,_16UL>.elems[0] = 0xffffffff;
  (this->values).super_array<unsigned_int,_16UL>.elems[1] = 0xffffffff;
  (this->values).super_array<unsigned_int,_16UL>.elems[2] = 0xffffffff;
  (this->values).super_array<unsigned_int,_16UL>.elems[3] = 0xffffffff;
joined_r0x0014f8ea:
  if (remainder == (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
    return;
  }
  *(undefined8 *)(remainder + 0x10) = 0;
  *(undefined8 *)(remainder[0x12].values.super_array<unsigned_char,_3UL>.elems + 2) = 0;
  *(undefined8 *)(remainder[10].values.super_array<unsigned_char,_3UL>.elems + 2) = 0;
  *(undefined8 *)(remainder[0xd].values.super_array<unsigned_char,_3UL>.elems + 1) = 0;
  *(undefined8 *)(remainder[5].values.super_array<unsigned_char,_3UL>.elems + 1) = 0;
  *(undefined8 *)(remainder + 8) = 0;
  *(undefined8 *)remainder = 0;
  *(undefined8 *)(remainder[2].values.super_array<unsigned_char,_3UL>.elems + 2) = 0;
  return;
}

Assistant:

constexpr auto eval_divide_knuth(const uintwide_t& other, uintwide_t* remainder = nullptr) -> void
    {
      // Use Knuth's long division algorithm.
      // The loop-ordering of indices in Knuth's original
      // algorithm has been reversed due to the data format
      // used here. Several optimizations and combinations
      // of logic have been carried out in the source code.

      // See also:
      // D.E. Knuth, "The Art of Computer Programming, Volume 2:
      // Seminumerical Algorithms", Addison-Wesley (1998),
      // Section 4.3.1 Algorithm D and Exercise 16.

      using local_uint_index_type = unsigned_fast_type;

      local_uint_index_type u_offset { };
      local_uint_index_type v_offset { };

      auto crit_u =       values.crbegin();
      auto crit_v = other.values.crbegin();

      while(crit_u != values.crend() && (*crit_u == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_u;
        ++u_offset;
      }

      while(crit_v != other.values.crend() && (*crit_v == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_v;
        ++v_offset;
      }

      if(v_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The denominator is zero. Set the maximum value and return.
        // This also catches (0 / 0) and sets the maximum value for it.
        static_cast<void>(operator=(limits_helper_max<IsSigned>())); // LCOV_EXCL_LINE

        if(remainder != nullptr) // LCOV_EXCL_LINE
        {
          detail::fill_unsafe(remainder->values.begin(), remainder->values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
      }
      else if(u_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The numerator is zero. Do nothing and return.

        if(remainder != nullptr)
        {
          *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
        }
      }
      else
      {
        const auto result_of_compare_left_with_right = compare(other);

        const auto left_is_less_than_right = (result_of_compare_left_with_right == INT8_C(-1));
        const auto left_is_equal_to_right  = (result_of_compare_left_with_right == INT8_C( 0));

        if(left_is_less_than_right)
        {
          // If the denominator is larger than the numerator,
          // then the result of the division is zero.
          if(remainder != nullptr)
          {
            *remainder = *this;
          }

          operator=(static_cast<std::uint8_t>(UINT8_C(0)));
        }
        else if(left_is_equal_to_right)
        {
          // If the denominator is equal to the numerator,
          // then the result of the division is one.
          operator=(static_cast<std::uint8_t>(UINT8_C(1)));

          if(remainder != nullptr)
          {
            *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
          }
        }
        else
        {
          eval_divide_knuth_core(u_offset, v_offset, other, remainder);
        }
      }
    }